

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::MultiTexShader::makeSafeLods
          (MultiTexShader *this,
          vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *textureSizes,
          IVec2 *viewportSize)

{
  int iVar1;
  int iVar2;
  deInt32 dVar3;
  reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  float fVar8;
  Matrix<float,_4,_4> *local_1e0;
  int local_1bc;
  int local_1b4;
  Vector<tcu::Vector<float,_2>,_3> local_174;
  Matrix<float,_4,_4> local_15c;
  int local_11c;
  int local_118;
  deInt32 minLevel;
  deInt32 maxLevel;
  float lodMin;
  float lodMax;
  float epsilon;
  float threshold;
  int unitNdx;
  Vec2 screenDerivate;
  undefined1 local_d4 [8];
  Mat4 shrinkScaleMat3d;
  Matrix<float,_3,_3> local_84;
  undefined1 local_60 [8];
  Mat4 shrinkScaleMat2d;
  IVec2 *viewportSize_local;
  vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *textureSizes_local;
  MultiTexShader *this_local;
  
  shrinkScaleMat2d.m_data.m_data[3].m_data._8_8_ = viewportSize;
  tcu::Matrix<float,_3,_3>::Matrix(&local_84,makeSafeLods::shrinkScaleMat2dData);
  matExtend3To4((Mat4 *)local_60,&local_84);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_84);
  tcu::Matrix<float,_3,_3>::Matrix
            ((Matrix<float,_3,_3> *)&screenDerivate,makeSafeLods::shrinkScaleMat3dData);
  matExtend3To4((Mat4 *)local_d4,(Mat3 *)&screenDerivate);
  tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)&screenDerivate);
  iVar1 = tcu::Vector<int,_2>::x((Vector<int,_2> *)shrinkScaleMat2d.m_data.m_data[3].m_data._8_8_);
  iVar2 = tcu::Vector<int,_2>::y((Vector<int,_2> *)shrinkScaleMat2d.m_data.m_data[3].m_data._8_8_);
  tcu::Vector<float,_2>::Vector
            ((Vector<float,_2> *)&threshold,1.0 / (float)iVar1,1.0 / (float)iVar2);
  epsilon = 0.0;
LAB_01ccc9c0:
  if (*(int *)&(this->super_ShaderProgram).field_0x154 <= (int)epsilon) {
    tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)local_d4);
    tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)local_60);
    return;
  }
  do {
    lodMax = 0.1;
    lodMin = 0.01;
    pvVar4 = std::
             vector<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
             ::operator[](&this->m_lodDerivateParts,(long)(int)epsilon);
    pvVar5 = std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::operator[]
                       (textureSizes,(long)(int)epsilon);
    maxLevel = (deInt32)calculateLodMax(pvVar4,pvVar5,(Vec2 *)&threshold);
    pvVar4 = std::
             vector<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
             ::operator[](&this->m_lodDerivateParts,(long)(int)epsilon);
    pvVar5 = std::vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>::operator[]
                       (textureSizes,(long)(int)epsilon);
    minLevel = (deInt32)calculateLodMin(pvVar4,pvVar5,(Vec2 *)&threshold);
    if (0.5 <= (float)maxLevel + 0.01) {
      dVar3 = ::deCeilFloatToInt32((float)maxLevel + 0.01 + 0.5);
      local_1b4 = dVar3 + -1;
    }
    else {
      local_1b4 = 0;
    }
    local_118 = local_1b4;
    if (0.5 <= (float)minLevel - 0.01) {
      dVar3 = ::deCeilFloatToInt32((float)minLevel + -0.01 + 0.5);
      local_1bc = dVar3 + -1;
    }
    else {
      local_1bc = 0;
    }
    local_11c = local_1bc;
    fVar8 = de::abs<float>((float)maxLevel);
    if (0.1 <= fVar8) {
      if (0.0 < (float)maxLevel) {
        fVar8 = deFloatFrac((float)maxLevel);
        fVar8 = de::abs<float>(fVar8 + -0.5);
        if (fVar8 < 0.1) goto LAB_01ccccc3;
      }
      fVar8 = de::abs<float>((float)minLevel);
      if (0.1 <= fVar8) {
        if (0.0 < (float)minLevel) {
          fVar8 = deFloatFrac((float)minLevel);
          fVar8 = de::abs<float>(fVar8 + -0.5);
          if (fVar8 < 0.1) goto LAB_01ccccc3;
        }
        if (local_118 == local_11c) break;
      }
    }
LAB_01ccccc3:
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_unitTypes,(long)(int)epsilon);
    if (*pvVar6 == 0x806f) {
      local_1e0 = (Matrix<float,_4,_4> *)local_d4;
    }
    else {
      local_1e0 = (Matrix<float,_4,_4> *)local_60;
    }
    pvVar7 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
             operator[](&this->m_transformations,(long)(int)epsilon);
    tcu::operator*(&local_15c,local_1e0,pvVar7);
    pvVar7 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
             operator[](&this->m_transformations,(long)(int)epsilon);
    tcu::Matrix<float,_4,_4>::operator=(pvVar7,&local_15c);
    tcu::Matrix<float,_4,_4>::~Matrix(&local_15c);
    pvVar7 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
             operator[](&this->m_transformations,(long)(int)epsilon);
    calculateLodDerivateParts(&local_174,pvVar7);
    pvVar4 = std::
             vector<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
             ::operator[](&this->m_lodDerivateParts,(long)(int)epsilon);
    *&pvVar4->m_data[0].m_data = local_174.m_data[0].m_data;
    *&pvVar4->m_data[1].m_data = local_174.m_data[1].m_data;
    *&pvVar4->m_data[2].m_data = local_174.m_data[2].m_data;
  } while( true );
  epsilon = (float)((int)epsilon + 1);
  goto LAB_01ccc9c0;
}

Assistant:

void MultiTexShader::makeSafeLods (const vector<IVec3>& textureSizes, const IVec2& viewportSize)
{
	DE_ASSERT((int)textureSizes.size() == m_numUnits);

	static const float shrinkScaleMat2dData[3*3] =
	{
		0.95f,	0.0f,	0.0f,
		0.0f,	0.95f,	0.0f,
		0.0f,	0.0f,	1.0f
	};
	static const float shrinkScaleMat3dData[3*3] =
	{
		0.95f,	0.0f,	0.0f,
		0.0f,	0.95f,	0.0f,
		0.0f,	0.0f,	0.95f
	};
	Mat4 shrinkScaleMat2d = matExtend3To4(Mat3(shrinkScaleMat2dData));
	Mat4 shrinkScaleMat3d = matExtend3To4(Mat3(shrinkScaleMat3dData));

	Vec2 screenDerivate(1.0f / (float)viewportSize.x(), 1.0f / (float)viewportSize.y());

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		// As long as LOD is too close to 0.0 or is positive and too close to a something-and-a-half (0.5, 1.5, 2.5 etc) or allowed lod range could round to different levels, zoom in a little to get a safer LOD.
		for (;;)
		{
			const float threshold = 0.1f;
			const float epsilon	= 0.01f;

			const float lodMax = calculateLodMax(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);
			const float lodMin = calculateLodMin(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);

			const deInt32 maxLevel = (lodMax + epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMax + epsilon + 0.5f) - 1);
			const deInt32 minLevel = (lodMin - epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMin - epsilon + 0.5f) - 1);

			if (de::abs(lodMax) < threshold || (lodMax > 0.0f && de::abs(deFloatFrac(lodMax) - 0.5f) < threshold) ||
				de::abs(lodMin) < threshold || (lodMin > 0.0f && de::abs(deFloatFrac(lodMin) - 0.5f) < threshold) ||
				maxLevel != minLevel)
			{
				m_transformations[unitNdx] = (m_unitTypes[unitNdx] == GL_TEXTURE_3D ? shrinkScaleMat3d : shrinkScaleMat2d) * m_transformations[unitNdx];
				m_lodDerivateParts[unitNdx] = calculateLodDerivateParts(m_transformations[unitNdx]);
			}
			else
				break;
		}
	}
}